

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables_ext.c
# Opt level: O3

int match_tcp(void *data,packet_t *pkt)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  tcp_t *ptVar4;
  uint uVar5;
  byte bVar6;
  bool bVar7;
  ushort uVar8;
  
  uVar5 = 0;
  if ((pkt->ip_proto == '\x06') && (ptVar4 = pkt->tcp, ptVar4 != (tcp_t *)0x0)) {
    uVar2 = *data;
    bVar6 = 1;
    if (uVar2 != 0) {
      uVar8 = ptVar4->src << 8 | ptVar4->src >> 8;
      uVar3 = *(ushort *)((long)data + 2);
      bVar6 = 0;
      if ((uVar2 == uVar8 || uVar3 != 0) &&
         ((uVar3 == 0 || (bVar6 = 0, uVar8 <= uVar3 && uVar2 <= uVar8)))) {
        bVar6 = 1;
      }
    }
    bVar1 = *(byte *)((long)data + 0xb);
    uVar5 = 0;
    if (bVar6 != (bVar1 & 1)) {
      uVar2 = *(ushort *)((long)data + 4);
      bVar7 = true;
      if (uVar2 != 0) {
        uVar8 = ptVar4->dst << 8 | ptVar4->dst >> 8;
        uVar3 = *(ushort *)((long)data + 6);
        bVar7 = false;
        if ((uVar2 == uVar8 || uVar3 != 0) &&
           ((uVar3 == 0 || (bVar7 = false, uVar8 <= uVar3 && uVar2 <= uVar8)))) {
          bVar7 = true;
        }
      }
      uVar5 = 0;
      if (bVar7 != ((bVar1 >> 1 & 1) != 0)) {
        uVar5 = (uint)(((bVar1 & 8) == 0) !=
                      ((*(byte *)((long)data + 10) & ptVar4->flag) != *(byte *)((long)data + 9)));
      }
    }
  }
  return uVar5;
}

Assistant:

static int match_tcp(void *data, packet_t *pkt)
{
	match_tcp_t *m = (match_tcp_t *)data;

	if (pkt->ip_proto != IPPROTO_TCP || pkt->tcp == NULL) {
		return 0;
	}

	if (INVF(m, INV_TCP_SRC, !match_port(ntohs(pkt->tcp->src), m->src))) {
		return 0;
	}

	if (INVF(m, INV_TCP_DST, !match_port(ntohs(pkt->tcp->dst), m->dst))) {
		return 0;
	}

	if (INVF(m, INV_TCP_FLAG, !((pkt->tcp->flag & m->flag_mask) == m->flag))) {
		return 0;
	}

	return 1;
}